

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::H1V2ConvertFiltered(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8 *puVar4;
  uint8 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint local_9c;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  int cr1_sample;
  int cb1_sample;
  int b;
  int cr0_sample;
  int cb0_sample;
  int a;
  int y_sample;
  int base_ofs;
  int x;
  int y1_base;
  int y0_base;
  int y_sample_base_ofs;
  uint8_t *p_C0Samples;
  uint8_t *p_YSamples;
  int c_y1;
  int c_y0;
  int w1;
  int w0;
  uint8 *d0;
  int half_image_y_size;
  int row;
  int y;
  uint BLOCKS_PER_MCU;
  jpeg_decoder *this_local;
  
  uVar13 = this->m_image_y_size - this->m_total_lines_left;
  uVar14 = uVar13 & 0xf;
  local_9c = (this->m_image_y_size >> 1) - 1;
  _w1 = this->m_pScan_line_0;
  iVar6 = 1;
  if ((uVar13 & 1) != 0) {
    iVar6 = 3;
  }
  iVar7 = 3;
  if ((uVar13 & 1) != 0) {
    iVar7 = 1;
  }
  uVar8 = (int)(uVar13 - 1) >> 1;
  if ((int)(uVar8 + 1) < (int)local_9c) {
    local_9c = uVar8 + 1;
  }
  p_C0Samples = this->m_pSample_buf;
  _y0_base = this->m_pSample_buf;
  if ((-1 < (int)uVar8) && (((uVar14 == 0 || (uVar14 == 0xf)) && (1 < this->m_total_lines_left)))) {
    if ((int)uVar13 < 1) {
      __assert_fail("y > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x6f3,"void jpgd::jpeg_decoder::H1V2ConvertFiltered()");
    }
    if ((this->m_sample_buf_prev_valid & 1U) == 0) {
      __assert_fail("m_sample_buf_prev_valid",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x6f4,"void jpgd::jpeg_decoder::H1V2ConvertFiltered()");
    }
    if (uVar14 == 0xf) {
      p_C0Samples = this->m_pSample_buf_prev;
    }
    _y0_base = this->m_pSample_buf_prev;
  }
  iVar9 = 0;
  if ((uVar13 & 8) != 0) {
    iVar9 = 0x40;
  }
  for (y_sample = 0; y_sample < this->m_image_x_size; y_sample = y_sample + 1) {
    iVar10 = (y_sample >> 3) * 0x100 + (y_sample & 7U);
    iVar11 = check_sample_buf_ofs(this,iVar10 + iVar9 + (uVar13 & 7) * 8);
    uVar14 = (uint)p_C0Samples[iVar11];
    iVar11 = iVar10 + (uVar8 & 7) * 8 + 0x80;
    iVar12 = check_sample_buf_ofs(this,iVar11);
    bVar1 = _y0_base[iVar12];
    iVar11 = check_sample_buf_ofs(this,iVar11 + 0x40);
    bVar2 = _y0_base[iVar11];
    iVar10 = iVar10 + (local_9c & 7) * 8 + 0x80;
    puVar4 = this->m_pSample_buf;
    iVar11 = check_sample_buf_ofs(this,iVar10);
    bVar3 = puVar4[iVar11];
    puVar4 = this->m_pSample_buf;
    iVar11 = check_sample_buf_ofs(this,iVar10 + 0x40);
    iVar10 = (int)((uint)bVar1 * iVar6 + (uint)bVar3 * iVar7 + 2) >> 2;
    iVar15 = (int)((uint)bVar2 * iVar6 + (uint)puVar4[iVar11] * iVar7 + 2) >> 2;
    iVar11 = this->m_crg[iVar15];
    iVar12 = this->m_cbg[iVar10];
    iVar10 = this->m_cbb[iVar10];
    uVar5 = clamp(uVar14 + this->m_crr[iVar15]);
    *_w1 = uVar5;
    uVar5 = clamp(uVar14 + (iVar11 + iVar12 >> 0x10));
    _w1[1] = uVar5;
    uVar5 = clamp(uVar14 + iVar10);
    _w1[2] = uVar5;
    _w1[3] = 0xff;
    _w1 = _w1 + 4;
  }
  return;
}

Assistant:

void jpeg_decoder::H1V2ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 4;
		int y = m_image_y_size - m_total_lines_left;
		int row = y & 15;

		const int half_image_y_size = (m_image_y_size >> 1) - 1;

		uint8* d0 = m_pScan_line_0;

		const int w0 = (row & 1) ? 3 : 1;
		const int w1 = (row & 1) ? 1 : 3;

		int c_y0 = (y - 1) >> 1;
		int c_y1 = JPGD_MIN(c_y0 + 1, half_image_y_size);

		const uint8_t* p_YSamples = m_pSample_buf;
		const uint8_t* p_C0Samples = m_pSample_buf;
		if ((c_y0 >= 0) && (((row & 15) == 0) || ((row & 15) == 15)) && (m_total_lines_left > 1))
		{
			assert(y > 0);
			assert(m_sample_buf_prev_valid);

			if ((row & 15) == 15)
				p_YSamples = m_pSample_buf_prev;

			p_C0Samples = m_pSample_buf_prev;
		}

		const int y_sample_base_ofs = ((row & 8) ? 64 : 0) + (row & 7) * 8;
		const int y0_base = (c_y0 & 7) * 8 + 128;
		const int y1_base = (c_y1 & 7) * 8 + 128;

		for (int x = 0; x < m_image_x_size; x++)
		{
			const int base_ofs = (x >> 3) * BLOCKS_PER_MCU * 64 + (x & 7);

			int y_sample = p_YSamples[check_sample_buf_ofs(base_ofs + y_sample_base_ofs)];

			int a = base_ofs + y0_base;
			int cb0_sample = p_C0Samples[check_sample_buf_ofs(a)];
			int cr0_sample = p_C0Samples[check_sample_buf_ofs(a + 64)];

			int b = base_ofs + y1_base;
			int cb1_sample = m_pSample_buf[check_sample_buf_ofs(b)];
			int cr1_sample = m_pSample_buf[check_sample_buf_ofs(b + 64)];

			int cb = (cb0_sample * w0 + cb1_sample * w1 + 2) >> 2;
			int cr = (cr0_sample * w0 + cr1_sample * w1 + 2) >> 2;

			int rc = m_crr[cr];
			int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
			int bc = m_cbb[cb];

			d0[0] = clamp(y_sample + rc);
			d0[1] = clamp(y_sample + gc);
			d0[2] = clamp(y_sample + bc);
			d0[3] = 255;

			d0 += 4;
		}
	}